

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_itrans_recon_dc.c
# Opt level: O1

void ihevcd_itrans_recon_dc_chroma
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  int iVar1;
  int iVar2;
  WORD32 quant_out;
  undefined6 in_register_0000008a;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  if (log2_trans_size != 0x1f) {
    uVar3 = 1 << ((byte)log2_trans_size & 0x1f);
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 2) {
      uVar4 = 1;
    }
    iVar5 = 0;
    iVar7 = 0;
    iVar2 = 0;
    uVar9 = uVar4;
    iVar6 = iVar5;
    iVar1 = iVar7;
    do {
      do {
        iVar8 = (uint)pu1_pred[iVar5] +
                (((int)CONCAT62(in_register_0000008a,i2_coeff_value) * 0x40 + 0x40 >> 1) + 0x800 >>
                0xc);
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        pu1_dst[iVar7] = (UWORD8)iVar8;
        iVar7 = iVar7 + 2;
        iVar5 = iVar5 + 2;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      iVar2 = iVar2 + 1;
      iVar7 = iVar1 + dst_strd;
      iVar5 = iVar6 + pred_strd;
      uVar9 = uVar4;
      iVar6 = iVar5;
      iVar1 = iVar7;
    } while (iVar2 != (int)uVar4);
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_chroma(UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 log2_trans_size,
                                   WORD16 i2_coeff_value)
{
    WORD32 row, col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;


    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    for(row = 0; row < trans_size; row++)
        for(col = 0; col < trans_size; col++)
            pu1_dst[row * dst_strd + (col << 1)] = CLIP_U8((pu1_pred[row * pred_strd + (col << 1)] + dc_value));

}